

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rbuTmpInsertFunc(sqlite3_context *pCtx,int nVal,sqlite3_value **apVal)

{
  void *pvVar1;
  int errCode;
  i64 iVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  pvVar1 = pCtx->pFunc->pUserData;
  iVar2 = sqlite3VdbeIntValue(*apVal);
  if ((int)iVar2 != 0) {
    *(long *)((long)pvVar1 + 0x118) =
         *(long *)((long)pvVar1 + 0x118) + (long)*(int *)((long)pvVar1 + 0xc4);
  }
  if (nVal < 1) {
    bVar5 = true;
    errCode = 0;
  }
  else {
    uVar3 = 1;
    do {
      errCode = sqlite3_bind_value(*(sqlite3_stmt **)((long)pvVar1 + 0xe8),(int)uVar3,
                                   apVal[uVar3 - 1]);
      bVar5 = errCode == 0;
      if (!bVar5) break;
      bVar4 = uVar3 < (uint)nVal;
      uVar3 = uVar3 + 1;
    } while (bVar4);
  }
  if (bVar5) {
    sqlite3_step(*(sqlite3_stmt **)((long)pvVar1 + 0xe8));
    errCode = sqlite3_reset(*(sqlite3_stmt **)((long)pvVar1 + 0xe8));
  }
  if (errCode == 0) {
    return;
  }
  sqlite3_result_error_code(pCtx,errCode);
  return;
}

Assistant:

static void rbuTmpInsertFunc(
  sqlite3_context *pCtx, 
  int nVal,
  sqlite3_value **apVal
){
  sqlite3rbu *p = sqlite3_user_data(pCtx);
  int rc = SQLITE_OK;
  int i;

  assert( sqlite3_value_int(apVal[0])!=0
      || p->objiter.eType==RBU_PK_EXTERNAL 
      || p->objiter.eType==RBU_PK_NONE 
  );
  if( sqlite3_value_int(apVal[0])!=0 ){
    p->nPhaseOneStep += p->objiter.nIndex;
  }

  for(i=0; rc==SQLITE_OK && i<nVal; i++){
    rc = sqlite3_bind_value(p->objiter.pTmpInsert, i+1, apVal[i]);
  }
  if( rc==SQLITE_OK ){
    sqlite3_step(p->objiter.pTmpInsert);
    rc = sqlite3_reset(p->objiter.pTmpInsert);
  }

  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(pCtx, rc);
  }
}